

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Error
Qiniu_Client_callWithBody
          (Qiniu_Client *self,Qiniu_Json **ret,char *url,char *body,Qiniu_Int64 bodyLen,
          char *mimeType,char *md5)

{
  CURL *curl_00;
  char *pcVar1;
  Qiniu_Error QVar2;
  char *contentMd5;
  CURL *curl;
  Qiniu_Header *headers;
  char userAgent [64];
  char ctxLength [64];
  char *ctxType;
  int retCode;
  char *mimeType_local;
  Qiniu_Int64 bodyLen_local;
  char *body_local;
  char *url_local;
  Qiniu_Json **ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  curl_00 = self->curl;
  QVar2 = Qiniu_Client_config(self);
  err._0_8_ = QVar2.message;
  self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
  if (QVar2.code == 200) {
    curl_easy_setopt(curl_00,0x2f,1);
    if (mimeType == (char *)0x0) {
      ctxLength._56_8_ = anon_var_dwarf_7573;
    }
    else {
      ctxLength._56_8_ = Qiniu_String_Concat2("Content-Type: ",mimeType);
    }
    snprintf(userAgent + 0x38,0x40,"Content-Length: %lld",bodyLen);
    snprintf((char *)&headers,0x40,"UserAgent: QiniuC/%s");
    curl = (CURL *)curl_slist_append(0,userAgent + 0x38);
    curl = (CURL *)curl_slist_append(curl,ctxLength._56_8_);
    curl = (CURL *)curl_slist_append(curl,&headers);
    curl = (CURL *)curl_slist_append(curl,"Expect:");
    if (md5 != (char *)0x0) {
      pcVar1 = Qiniu_String_Concat2("Content-MD5: ",md5);
      curl = (CURL *)curl_slist_append(curl,pcVar1);
    }
    if ((self->auth).itbl != (Qiniu_Auth_Itbl *)0x0) {
      mimeType_local = (char *)bodyLen;
      if (body == (char *)0x0) {
        mimeType_local = (char *)0x0;
      }
      QVar2 = Qiniu_Do_Auth(self,"POST",(Qiniu_Header **)&curl,url,body,(size_t)mimeType_local);
      err._0_8_ = QVar2.message;
      self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
      if (QVar2.code != 200) goto LAB_001176f0;
    }
    curl_easy_setopt(curl_00,0x2727,curl);
    QVar2 = Qiniu_callex(curl_00,&self->b,&self->root,0,&self->respHeader);
    err._0_8_ = QVar2.message;
    self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
    curl_slist_free_all(curl);
    if (mimeType != (char *)0x0) {
      free((void *)ctxLength._56_8_);
    }
    *ret = self->root;
  }
LAB_001176f0:
  QVar2.message = (char *)err._0_8_;
  QVar2._0_8_ = self_local;
  return QVar2;
}

Assistant:

static Qiniu_Error Qiniu_Client_callWithBody(
    Qiniu_Client *self, Qiniu_Json **ret, const char *url,
    const char *body, Qiniu_Int64 bodyLen, const char *mimeType, const char *md5)
{
    int retCode = 0;
    Qiniu_Error err;
    const char *ctxType;
    char ctxLength[64], userAgent[64];
    Qiniu_Header *headers;
    CURL *curl = (CURL *)self->curl;
    err = Qiniu_Client_config(self);
    if (err.code != 200)
    {
        return err;
    }

    curl_easy_setopt(curl, CURLOPT_POST, 1);

    if (mimeType == NULL)
    {
        ctxType = "Content-Type: application/octet-stream";
    }
    else
    {
        ctxType = Qiniu_String_Concat2("Content-Type: ", mimeType);
    }

    Qiniu_snprintf(ctxLength, 64, "Content-Length: %lld", bodyLen);
    Qiniu_snprintf(userAgent, 64, "UserAgent: QiniuC/%s", version);
    headers = curl_slist_append(NULL, ctxLength);
    headers = curl_slist_append(headers, ctxType);
    headers = curl_slist_append(headers, userAgent);
    headers = curl_slist_append(headers, "Expect:");
    if (md5 != NULL)
    {
        char *contentMd5 = Qiniu_String_Concat2("Content-MD5: ", md5);
        headers = curl_slist_append(headers, contentMd5);
    }

    if (self->auth.itbl != NULL)
    {
        if (body == NULL)
        {
            bodyLen = 0;
        }
        err = Qiniu_Do_Auth(self, "POST", &headers, url, body, (size_t)bodyLen);
        if (err.code != 200)
        {
            return err;
        }
    }

    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

    err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);

    curl_slist_free_all(headers);
    if (mimeType != NULL)
    {
        free((void *)ctxType);
    }

    *ret = self->root;
    return err;
}